

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

GdlExpression * __thiscall
GdlStringExpression::ConvertFeatureSettingValue
          (GdlStringExpression *this,GdlFeatureDefn *pfeat,bool *fErr)

{
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  GdlNumericExpression *this_00;
  undefined1 *in_RDX;
  GdlFeatureDefn *in_RSI;
  GdlNumericExpression *in_RDI;
  GdlNumericExpression *pexpValue;
  byte b4;
  byte b3;
  byte b2;
  byte b1;
  size_type cb;
  int nValue;
  undefined8 in_stack_fffffffffffffed8;
  string *in_stack_ffffffffffffff00;
  allocator *paVar4;
  string *in_stack_ffffffffffffff08;
  GdlObject *in_stack_ffffffffffffff10;
  GrcErrorList *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  GrcErrorList *in_stack_ffffffffffffff30;
  allocator local_b9;
  string local_b8 [43];
  byte local_8d;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  ulong local_30;
  uint local_24;
  undefined1 *local_20;
  GdlNumericExpression *local_8;
  
  local_20 = in_RDX;
  bVar1 = GdlFeatureDefn::IsLanguageFeature(in_RSI);
  if (bVar1) {
    local_24 = 0;
    local_30 = std::__cxx11::string::length();
    uVar2 = std::__cxx11::string::length();
    if (uVar2 < 5) {
      uVar2 = std::__cxx11::string::length();
      if (uVar2 < 4) {
        paVar4 = &local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_88,"Possibly invalid language ID--4-byte string expected",paVar4);
        GrcErrorList::AddWarning
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                   (GdlObject *)in_stack_ffffffffffffff20,(string *)in_RDI);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
    }
    else {
      paVar4 = &local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"Invalid language ID--must be a 4-byte string",paVar4);
      GrcErrorList::AddError
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 (GdlObject *)in_stack_ffffffffffffff20,(string *)in_RDI);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      *local_20 = 1;
    }
    if (local_30 == 0) {
      local_8a = 0;
    }
    else {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)&in_RDI->m_munits);
      local_8a = *pbVar3;
    }
    if (local_30 < 2) {
      local_8b = 0;
    }
    else {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)&in_RDI->m_munits);
      local_8b = *pbVar3;
    }
    if (local_30 < 3) {
      local_8c = 0;
    }
    else {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)&in_RDI->m_munits);
      local_8c = *pbVar3;
    }
    if (local_30 < 4) {
      local_8d = 0;
    }
    else {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)&in_RDI->m_munits);
      local_8d = *pbVar3;
    }
    local_24 = (uint)local_8a << 0x18 | (uint)local_8b << 0x10 | (uint)local_8c << 8 |
               (uint)local_8d;
    this_00 = (GdlNumericExpression *)operator_new(0x40);
    GdlNumericExpression::GdlNumericExpression
              (this_00,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_8 = this_00;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Inappropriate value of feature setting: ",&local_b9);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff20,(string *)&in_RDI->m_munits);
    GrcErrorList::AddError
              (in_stack_ffffffffffffff20,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    *local_20 = 1;
    local_8 = in_RDI;
  }
  return (GdlExpression *)local_8;
}

Assistant:

GdlExpression * GdlStringExpression::ConvertFeatureSettingValue(GdlFeatureDefn * pfeat, bool & fErr)
{
	if (pfeat->IsLanguageFeature())
	{
		int nValue = 0;
		auto cb = m_staValue.length();
		if (m_staValue.length() > 4)
		{
			g_errorList.AddError(2115, this,
				"Invalid language ID--must be a 4-byte string");
			fErr = true;
		}
		else if (m_staValue.length() < 4)
		{
			g_errorList.AddWarning(2520, this,
				"Possibly invalid language ID--4-byte string expected");
		}
		gr::byte b1, b2, b3, b4;
		b1 = (cb > 0) ? m_staValue[0] : 0;
		b2 = (cb > 1) ? m_staValue[1] : 0;
		b3 = (cb > 2) ? m_staValue[2] : 0;
		b4 = (cb > 3) ? m_staValue[3] : 0;
		nValue = (b1 << 24) | (b2 << 16) | (b3 << 8) | b4;

		//	Caller will replace original expression with numeric value.
		GdlNumericExpression * pexpValue = new GdlNumericExpression(nValue);
		return pexpValue;
	}
	else
	{
		g_errorList.AddError(2116, this,
			"Inappropriate value of feature setting: ",
			m_staValue);
		fErr = true;
	}
	return this;
}